

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O2

size_t __thiscall
axl::err::Error::format_va(Error *this,Guid *guid,uint_t code,char *formatString,axl_va_list *va)

{
  ErrorHdr *pEVar1;
  undefined8 uVar2;
  size_t size;
  size_t packSize;
  axl_va_list local_c8;
  axl_va_list local_a8;
  PackerSeq packer;
  axl_va_list local_68;
  axl_va_list local_48;
  
  packer.super_Packer._vptr_Packer = (_func_int **)&PTR_pack_va_001994f8;
  packer.m_sequence.super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>.m_p
       = (Packer **)0x0;
  packer.m_sequence.super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>.
  m_hdr = (Hdr *)0x0;
  packer.m_sequence.super_ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>.
  m_count = 0;
  sl::PackerSeq::format(&packer,formatString);
  local_a8._0_8_ = *(undefined8 *)va;
  local_a8._8_8_ = *(undefined8 *)&va->field_0x8;
  local_a8._16_8_ = *(undefined8 *)&va->field_0x10;
  local_a8.m_isInitialized = true;
  sl::PackerSeq::pack_va(&local_48,&packer,(void *)0x0,&packSize,&local_a8);
  if (local_48.m_isInitialized == true) {
    local_48.m_isInitialized = false;
  }
  if (local_a8.m_isInitialized == true) {
    local_a8.m_isInitialized = false;
  }
  size = packSize + 0x18;
  rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
            (&this->super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>,size,
             false);
  pEVar1 = (this->super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>).
           super_ErrorRef.super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_p;
  if (pEVar1 == (ErrorHdr *)0x0) {
    size = 0xffffffffffffffff;
  }
  else {
    pEVar1->m_size = (uint32_t)size;
    uVar2 = *(undefined8 *)((long)&guid->field_0 + 8);
    *(undefined8 *)&(pEVar1->m_guid).field_0 = *(undefined8 *)&guid->field_0;
    *(undefined8 *)((long)&(pEVar1->m_guid).field_0 + 8) = uVar2;
    pEVar1 = (this->super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>).
             super_ErrorRef.super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_p;
    pEVar1->m_code = code;
    local_c8._0_8_ = *(undefined8 *)va;
    local_c8._8_8_ = *(undefined8 *)&va->field_0x8;
    local_c8._16_8_ = *(undefined8 *)&va->field_0x10;
    local_c8.m_isInitialized = true;
    sl::PackerSeq::pack_va(&local_68,&packer,pEVar1 + 1,&packSize,&local_c8);
    if (local_68.m_isInitialized == true) {
      local_68.m_isInitialized = false;
    }
    if (local_c8.m_isInitialized == true) {
      local_c8.m_isInitialized = false;
    }
  }
  sl::PackerSeq::~PackerSeq(&packer);
  return size;
}

Assistant:

size_t
Error::format_va(
	const sl::Guid& guid,
	uint_t code,
	const char* formatString,
	axl_va_list va
) {
	sl::PackerSeq packer;
	packer.format(formatString);

	size_t packSize;
	packer.pack_va(NULL, &packSize, va);

	size_t size = sizeof(ErrorHdr) + packSize;

	createBuffer(size);
	if (!m_p)
		return -1;

	m_p->m_size = (uint32_t)size;
	m_p->m_guid = guid;
	m_p->m_code = code;

	packer.pack_va(m_p + 1, &packSize, va);
	return size;
}